

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O0

bool free_memory(uint adr,int type)

{
  uint uVar1;
  MemoryNode *pMVar2;
  MemoryNode *pMVar3;
  MemoryNode *new_free;
  MemoryNode *data_first;
  MemoryNode *next;
  MemoryNode *forword;
  MemoryNode *pMStack_30;
  uint adr_size;
  MemoryNode *used;
  MemoryNode *free_head;
  MemoryNode *used_head;
  uint local_10;
  int type_local;
  uint adr_local;
  
  free_head = (MemoryNode *)0x0;
  used = (MemoryNode *)0x0;
  used_head._4_4_ = type;
  local_10 = adr;
  init_get_head(type,&used,&free_head);
  for (pMStack_30 = free_head;
      (pMStack_30 != (MemoryNode *)0x0 && (pMStack_30->address != local_10));
      pMStack_30 = pMStack_30->next) {
  }
  if (pMStack_30 == (MemoryNode *)0x0) {
    type_local._3_1_ = false;
  }
  else {
    uVar1 = pMStack_30->size;
    pMVar2 = pMStack_30->forward;
    pMVar3 = pMStack_30->next;
    pMVar2->next = pMStack_30->next;
    if (pMVar3 != (MemoryNode *)0x0) {
      pMVar3->forward = pMVar2;
    }
    if (pMStack_30 != (MemoryNode *)0x0) {
      operator_delete(pMStack_30,0x20);
    }
    pMVar2 = used->next;
    pMVar3 = (MemoryNode *)operator_new(0x20);
    pMVar3->address = local_10;
    pMVar3->size = uVar1;
    pMVar3->forward = used;
    pMVar3->next = pMVar2;
    used->next = pMVar3;
    pMVar2->forward = pMVar3;
    type_local._3_1_ = true;
  }
  return type_local._3_1_;
}

Assistant:

EXPORT bool free_memory(unsigned adr,int type) {
	MemoryNode *used_head=nullptr, *free_head = nullptr;
	init_get_head(type, free_head, used_head);
	MemoryNode * used = used_head;
	unsigned adr_size;
	while (used) //获取使用的链表
	{
		if (used->address == adr) break;
		else used = used->next;
	}
	if (!used) return false;
	else
	{
		adr_size = used->size;
		/*从使用链表中取下*/
		MemoryNode *forword = used->forward;
		MemoryNode *next = used->next;
		forword->next = used->next;
		if (next) next->forward = forword;
		delete(used);

		/*加入未使用的节点采用头插入*/

		MemoryNode *data_first = free_head->next;
		MemoryNode *new_free = new MemoryNode;
		new_free->address = adr;
		new_free->size = adr_size;
		new_free->forward = free_head;
		new_free->next = data_first;
		free_head->next = new_free;
		data_first->forward = new_free;

		return true;
	}
}